

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

record * push_front(cache *Cache,char *label)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  record *prVar4;
  void *pvVar5;
  hashnode *phVar6;
  record *prVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  _Bool is_find;
  _Bool local_39;
  char *local_38;
  
  local_39 = false;
  local_38 = label;
  if (Cache->max_length - 1 <= Cache->length) {
    iVar9 = -10;
    do {
      if (Cache->length != 0) {
        prVar7 = Cache->records;
        uVar1 = Cache->last;
        uVar8 = (ulong)(int)uVar1;
        iVar11 = prVar7[uVar8].last;
        prVar7[uVar8].valid = false;
        if ((-1 < (long)uVar8) && (uVar8 < Cache->max_length)) {
          iVar2 = Cache->stack_top;
          Cache->stack_top = iVar2 + 1;
          Cache->stack[(long)iVar2 + 1] = uVar1;
        }
        pvVar5 = (*Cache->get_label)(prVar7 + Cache->last);
        reset_hash_node(&Cache->label_hash,pvVar5);
        Cache->used_size = Cache->used_size - (long)Cache->records[Cache->last].size;
        (*Cache->realse)(Cache->records + Cache->last);
        Cache->records[iVar11].next = -1;
        Cache->last = iVar11;
        sVar3 = Cache->length;
        Cache->length = sVar3 - 1;
        if (sVar3 != 2) {
          if (sVar3 != 1) goto LAB_00102d80;
          Cache->last = 0;
          iVar11 = 0;
        }
        Cache->first = iVar11;
      }
LAB_00102d80:
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
  }
  if (Cache->max_size < Cache->used_size + 0x400) {
    iVar9 = 9;
    do {
      if (Cache->length != 0) {
        prVar7 = Cache->records;
        uVar1 = Cache->last;
        uVar8 = (ulong)(int)uVar1;
        iVar11 = prVar7[uVar8].last;
        prVar7[uVar8].valid = false;
        if ((-1 < (long)uVar8) && (uVar8 < Cache->max_length)) {
          iVar2 = Cache->stack_top;
          Cache->stack_top = iVar2 + 1;
          Cache->stack[(long)iVar2 + 1] = uVar1;
        }
        pvVar5 = (*Cache->get_label)(prVar7 + Cache->last);
        reset_hash_node(&Cache->label_hash,pvVar5);
        Cache->used_size = Cache->used_size - (long)Cache->records[Cache->last].size;
        (*Cache->realse)(Cache->records + Cache->last);
        Cache->records[iVar11].next = -1;
        Cache->last = iVar11;
        sVar3 = Cache->length;
        Cache->length = sVar3 - 1;
        if (sVar3 != 2) {
          if (sVar3 != 1) goto LAB_00102e59;
          Cache->last = 0;
          iVar11 = 0;
        }
        Cache->first = iVar11;
      }
LAB_00102e59:
      bVar12 = iVar9 != 0;
      iVar9 = iVar9 + -1;
    } while ((bVar12) || (iVar9 = 9, Cache->max_size < Cache->used_size + 0x400));
  }
  phVar6 = set_hashnode(&Cache->label_hash,local_38,(void *)0x0,&local_39);
  if (local_39 == true) {
    prVar7 = (record *)phVar6->record;
    prVar4 = Cache->records;
    if ((long)prVar7 - (long)prVar4 < 1) {
      uVar8 = 0xffffffff;
    }
    else {
      uVar10 = ((ulong)((long)prVar7 - (long)prVar4) >> 3) * -0x5555555555555555;
      uVar8 = 0xffffffff;
      if (uVar10 < Cache->max_length || uVar10 - Cache->max_length == 0) {
        uVar8 = uVar10 & 0xffffffff;
      }
    }
    if ((int)uVar8 == Cache->first) {
      return prVar7;
    }
    iVar9 = prVar7->last;
    if (prVar7->next < 1) {
      Cache->last = iVar9;
      prVar4[iVar9].next = -1;
    }
    else {
      prVar4[iVar9].next = prVar7->next;
      prVar4[prVar7->next].last = iVar9;
    }
  }
  else {
    iVar9 = Cache->stack_top;
    if ((long)iVar9 < 1) {
      uVar8 = 0xffffffff;
    }
    else {
      Cache->stack_top = iVar9 + -1;
      uVar8 = (ulong)Cache->stack[iVar9];
    }
    if ((int)uVar8 < 0) {
      printf("no remain space");
      exit(1);
    }
    prVar7 = Cache->records + uVar8;
    phVar6->record = prVar7;
    prVar7->valid = true;
    prVar7->size = 0;
    Cache->length = Cache->length + 1;
  }
  iVar9 = (int)uVar8;
  if (Cache->length < 2) {
    prVar7->next = -1;
    prVar7->last = 0;
    Cache->records->next = iVar9;
    Cache->last = iVar9;
  }
  else {
    iVar11 = Cache->first;
    prVar7->next = iVar11;
    prVar7->last = 0;
    prVar4 = Cache->records;
    prVar4[iVar11].last = iVar9;
    prVar4->next = iVar9;
  }
  Cache->first = iVar9;
  return prVar7;
}

Assistant:

static inline struct record* push_front(cache*Cache,const char *label) {
  //向头插入
  bool is_find=false;
  hashnode *node;
  struct record *operate_record;
  // struct record_data* operate_record_data;
  int operate_record_addr;
  // time_t now = time(NULL);
  
  // if (now >= ttl){
  //   return -1;
  // }
  if (is_full(Cache)) {
    pop_back(Cache);
    #ifdef LOG_INCLUDED
    log_debug("pop back done\n");
    #endif
  }

  while (Cache->used_size + 1024 > Cache->max_size) {//预分配1kB内存，可能会超出范围
    pop_back(Cache);
    #ifdef LOG_INCLUDED
    log_debug("pop back done\n");
    #endif
  }
  node = set_hashnode(&Cache->label_hash,(void*)label,NULL,&is_find);//暂时用NULL占位

  if (is_find) { //找到了,但是也需要把它拉到最前面去
    operate_record = node->record;
    operate_record_addr = get_record_addr(Cache,operate_record);
    // operate_record_data = &operate_record->data;
    // //找到最后一个元素，并分配一个空间
    // while(operate_record_data->next){
    //   operate_record_data = operate_record_data->next;
    // }
    // operate_record_data =  operate_record_data->next = (struct record_data*)malloc(sizeof(struct record_data));
    
    //如果本来就是第一个，后面就不需要做了
    if (operate_record_addr == Cache->first) {
      // memcpy(&operate_record_data->ip, ip, sizeof(struct IP));
      return operate_record;
    }
    //否则就要把节点先切出来
    linklist_remove_node(Cache, operate_record);
  } else {
    //需要新分配一个空间
    if ((operate_record_addr = cache_stack_pop(Cache)) < 0) {
      printf("no remain space");
      exit(EXIT_FAILURE);
    }
    node->record = &Cache->records[operate_record_addr];
    operate_record = &Cache->records[operate_record_addr];
    // operate_record_data = &operate_record->data;
    operate_record_addr = operate_record_addr;
    // strcpy_s(operate_record->label,sizeof(operate_record->label),label);
    operate_record->valid = 1;
    operate_record->size = 0;
    Cache->length++;
    // Cache->used_size += record_size;
  }
  // memcpy(&operate_record->data.ip, ip, sizeof(struct IP));
  // operate_record->data.next=NULL;
  // operate_record->data.ttl = ttl;
  // operate_record->record_data_length++;

  if (Cache->length > 1) {
    operate_record->next = Cache->first;
    operate_record->last = LRU_BUFFER_HEAD_POINT;
    Cache->first = Cache->records[LRU_BUFFER_HEAD_POINT].next =
        Cache->records[Cache->first].last = operate_record_addr;
  } else {
    //只有新插入节点一个节点
    operate_record->next = -1;
    operate_record->last = LRU_BUFFER_HEAD_POINT;
    Cache->first = Cache->last = Cache->records[LRU_BUFFER_HEAD_POINT].next =
        operate_record_addr;
  }
  return operate_record;
}